

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

char * coda_strxstr(char *s,char *n,size_t len)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  ulong in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t nsz;
  char *en;
  char *es;
  char *x;
  char *w;
  char *local_30;
  char *local_28;
  char *local_10;
  char *local_8;
  
  if ((in_RDI == (char *)0x0) || (*in_RDI == '\0')) {
    local_8 = (char *)0x0;
  }
  else {
    local_8 = in_RDI;
    if ((in_RSI != (char *)0x0) && (*in_RSI != '\0')) {
      sVar3 = strlen(in_RSI);
      if (in_RDX < sVar3) {
        local_8 = (char *)0x0;
      }
      else {
        for (local_10 = in_RDI; local_10 < in_RDI + in_RDX; local_10 = local_10 + 1) {
          iVar1 = tolower((int)*local_10);
          iVar2 = tolower((int)*in_RSI);
          if (iVar1 == iVar2) {
            local_30 = in_RSI;
            for (local_28 = local_10; local_28 < in_RDI + in_RDX && local_30 < in_RSI + sVar3;
                local_28 = local_28 + 1) {
              iVar1 = tolower((int)*local_28);
              iVar2 = tolower((int)*local_30);
              if (iVar1 != iVar2) break;
              local_30 = local_30 + 1;
            }
            if (local_30 == in_RSI + sVar3) {
              return local_10;
            }
          }
        }
        local_8 = (char *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

char *coda_strxstr(const char *s, const char *n, size_t len)
{
	const char *w;
	const char *x;
	const char *es;
	const char *en;
	size_t nsz;

	if (!s || !*s) return NULL;
	if (!n || !*n) return (char *) s;
	if (len < (nsz = strlen(n))) return NULL;

	es = s + len;
	en = n + nsz;

	for (; s < es; ++s)
	{
		if (tolower(*s) == tolower(*n))
		{
			for (w = s, x = n; w < es && x < en; ++w, ++x)
			{
				if (tolower(*w) != tolower(*x)) break;
			}

			if (x == en) return (char *) s;
		}
	}

	return NULL;
}